

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O0

Ivy_Obj_t * Ivy_Miter(Ivy_Man_t *p,Vec_Ptr_t *vPairs)

{
  Ivy_Obj_t *pIVar1;
  int local_1c;
  int i;
  Vec_Ptr_t *vPairs_local;
  Ivy_Man_t *p_local;
  
  if (vPairs->nSize < 1) {
    __assert_fail("vPairs->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyOper.c"
                  ,0x10b,"Ivy_Obj_t *Ivy_Miter(Ivy_Man_t *, Vec_Ptr_t *)");
  }
  if (vPairs->nSize % 2 == 0) {
    for (local_1c = 0; local_1c < vPairs->nSize; local_1c = local_1c + 2) {
      pIVar1 = Ivy_Exor(p,(Ivy_Obj_t *)vPairs->pArray[local_1c],
                        (Ivy_Obj_t *)vPairs->pArray[local_1c + 1]);
      pIVar1 = Ivy_Not(pIVar1);
      vPairs->pArray[local_1c / 2] = pIVar1;
    }
    vPairs->nSize = vPairs->nSize / 2;
    pIVar1 = Ivy_Multi_rec(p,(Ivy_Obj_t **)vPairs->pArray,vPairs->nSize,IVY_AND);
    pIVar1 = Ivy_Not(pIVar1);
    return pIVar1;
  }
  __assert_fail("vPairs->nSize % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyOper.c"
                ,0x10c,"Ivy_Obj_t *Ivy_Miter(Ivy_Man_t *, Vec_Ptr_t *)");
}

Assistant:

Ivy_Obj_t * Ivy_Miter( Ivy_Man_t * p, Vec_Ptr_t * vPairs )
{
    int i;
    assert( vPairs->nSize > 0 );
    assert( vPairs->nSize % 2 == 0 );
    // go through the cubes of the node's SOP
    for ( i = 0; i < vPairs->nSize; i += 2 )
        vPairs->pArray[i/2] = Ivy_Not( Ivy_Exor( p, (Ivy_Obj_t *)vPairs->pArray[i], (Ivy_Obj_t *)vPairs->pArray[i+1] ) );
    vPairs->nSize = vPairs->nSize/2;
    return Ivy_Not( Ivy_Multi_rec( p, (Ivy_Obj_t **)vPairs->pArray, vPairs->nSize, IVY_AND ) );
}